

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,php *this,FieldDescriptor *field)

{
  Type TVar1;
  char *pcVar2;
  allocator local_9;
  
  TVar1 = FieldDescriptor::type((FieldDescriptor *)this);
  switch(TVar1) {
  case TYPE_DOUBLE:
    pcVar2 = "double";
    break;
  case TYPE_FLOAT:
    pcVar2 = "float";
    break;
  case TYPE_INT64:
    pcVar2 = "int64";
    break;
  case TYPE_UINT64:
    pcVar2 = "uint64";
    break;
  case TYPE_INT32:
    pcVar2 = "int32";
    break;
  case TYPE_FIXED64:
    pcVar2 = "fixed64";
    break;
  case TYPE_FIXED32:
    pcVar2 = "fixed32";
    break;
  case TYPE_BOOL:
    pcVar2 = "bool";
    break;
  case TYPE_STRING:
    pcVar2 = "string";
    break;
  case TYPE_GROUP:
    pcVar2 = "group";
    break;
  case TYPE_MESSAGE:
    pcVar2 = "message";
    break;
  case TYPE_BYTES:
    pcVar2 = "bytes";
    break;
  case TYPE_UINT32:
    pcVar2 = "uint32";
    break;
  case TYPE_ENUM:
    pcVar2 = "enum";
    break;
  case TYPE_SFIXED32:
    pcVar2 = "sfixed32";
    break;
  case TYPE_SFIXED64:
    pcVar2 = "sfixed64";
    break;
  case TYPE_SINT32:
    pcVar2 = "sint32";
    break;
  case MAX_TYPE:
    pcVar2 = "sint64";
    break;
  default:
    pcVar2 = "";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string TypeName(const FieldDescriptor* field) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32: return "int32";
    case FieldDescriptor::TYPE_INT64: return "int64";
    case FieldDescriptor::TYPE_UINT32: return "uint32";
    case FieldDescriptor::TYPE_UINT64: return "uint64";
    case FieldDescriptor::TYPE_SINT32: return "sint32";
    case FieldDescriptor::TYPE_SINT64: return "sint64";
    case FieldDescriptor::TYPE_FIXED32: return "fixed32";
    case FieldDescriptor::TYPE_FIXED64: return "fixed64";
    case FieldDescriptor::TYPE_SFIXED32: return "sfixed32";
    case FieldDescriptor::TYPE_SFIXED64: return "sfixed64";
    case FieldDescriptor::TYPE_DOUBLE: return "double";
    case FieldDescriptor::TYPE_FLOAT: return "float";
    case FieldDescriptor::TYPE_BOOL: return "bool";
    case FieldDescriptor::TYPE_ENUM: return "enum";
    case FieldDescriptor::TYPE_STRING: return "string";
    case FieldDescriptor::TYPE_BYTES: return "bytes";
    case FieldDescriptor::TYPE_MESSAGE: return "message";
    case FieldDescriptor::TYPE_GROUP: return "group";
    default: assert(false); return "";
  }
}